

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::try_connect_more_peers(session_impl *this)

{
  ulong uVar1;
  pointer pptVar2;
  pointer pptVar3;
  _Elt_pointer ppVar4;
  size_t sVar5;
  mutex *pmVar6;
  int iVar7;
  int iVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar9;
  element_type *this_01;
  int iVar10;
  bool bVar11;
  int local_60;
  unique_lock<std::mutex> local_58;
  mutex *local_48;
  ulong local_40;
  counters *local_38;
  
  if (this->m_abort == false) {
    sVar5 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_58._M_device = &(this->m_settings).m_mutex;
    local_58._M_owns = false;
    local_48 = local_58._M_device;
    ::std::unique_lock<std::mutex>::lock(&local_58);
    local_58._M_owns = true;
    iVar10 = (this->m_settings).m_store.m_ints._M_elems[0x55];
    ::std::unique_lock<std::mutex>::~unique_lock(&local_58);
    if ((int)sVar5 < iVar10) {
      local_58._M_device = local_48;
      local_58._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_58);
      local_58._M_owns = true;
      iVar10 = (this->m_settings).m_store.m_ints._M_elems[0x12];
      ::std::unique_lock<std::mutex>::~unique_lock(&local_58);
      pmVar6 = local_48;
      iVar9 = this->m_boost_connections;
      if (0 < iVar9) {
        iVar7 = iVar9 - iVar10;
        bVar11 = iVar10 <= iVar9;
        iVar8 = 0;
        iVar10 = -(iVar9 - iVar10);
        if (iVar7 != 0 && bVar11) {
          iVar10 = iVar8;
          iVar8 = iVar7;
        }
        this->m_boost_connections = iVar8;
      }
      if (0 < iVar10) {
        local_58._M_device = local_48;
        local_58._M_owns = false;
        ::std::unique_lock<std::mutex>::lock(&local_58);
        local_58._M_owns = true;
        iVar9 = (this->m_settings).m_store.m_ints._M_elems[0x55];
        ::std::unique_lock<std::mutex>::~unique_lock(&local_58);
        sVar5 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_58._M_device = pmVar6;
        local_58._M_owns = false;
        ::std::unique_lock<std::mutex>::lock(&local_58);
        local_58._M_owns = true;
        uVar1 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[0];
        ::std::unique_lock<std::mutex>::~unique_lock(&local_58);
        if ((uVar1 >> 0x2c & 1) != 0) {
          local_60 = (int)sVar5;
          iVar9 = iVar9 - local_60;
          if (0x7ffffffd < iVar9) {
            iVar9 = 0x7ffffffe;
          }
          iVar9 = (iVar9 - (iVar9 + 1 >> 0x1f)) + 1 >> 1;
          if (iVar9 <= iVar10) {
            iVar10 = iVar9;
          }
        }
        pptVar2 = (this->m_torrent_lists).
                  super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                  ._M_elems[2].
                  super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                  .
                  super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pptVar3 = *(pointer *)
                   ((long)&(this->m_torrent_lists).
                           super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                           ._M_elems[2].
                           super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                           .
                           super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                           ._M_impl.super__Vector_impl_data + 8);
        if (((pptVar2 != pptVar3) ||
            ((this->m_torrent_lists).
             super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
             ._M_elems[3].
             super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
             super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             *(pointer *)
              ((long)&(this->m_torrent_lists).
                      super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                      ._M_elems[3].
                      super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                      .
                      super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                      ._M_impl.super__Vector_impl_data + 8))) && (0 < iVar10)) {
          local_40 = (ulong)(uint)((int)((ulong)((long)*(pointer *)
                                                        ((long)&(this->m_torrent_lists).
                                                                                                                                
                                                  super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                                                  ._M_elems[3].
                                                  super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                                  .
                                                  super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                                (long)(this->m_torrent_lists).
                                                                                                            
                                                  super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                                                  ._M_elems[3].
                                                  super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                                  .
                                                  super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                  (int)((ulong)((long)pptVar3 - (long)pptVar2) >> 3));
          local_38 = &this->m_stats_counters;
          iVar9 = 0;
          do {
            if ((int)((ulong)((long)*(pointer *)
                                     ((long)&(this->m_torrent_lists).
                                             super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                                             ._M_elems[2].
                                             super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                             .
                                             super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                             ._M_impl.super__Vector_impl_data + 8) -
                             (long)(this->m_torrent_lists).
                                   super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                                   ._M_elems[2].
                                   super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                   .
                                   super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) <=
                this->m_next_downloading_connect_torrent) {
              this->m_next_downloading_connect_torrent = 0;
            }
            if ((int)((ulong)((long)*(pointer *)
                                     ((long)&(this->m_torrent_lists).
                                             super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                                             ._M_elems[3].
                                             super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                             .
                                             super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                             ._M_impl.super__Vector_impl_data + 8) -
                             (long)(this->m_torrent_lists).
                                   super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                                   ._M_elems[3].
                                   super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                   .
                                   super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) <=
                this->m_next_finished_connect_torrent) {
              this->m_next_finished_connect_torrent = 0;
            }
            while (ppVar4 = (this->m_prio_torrents).
                            super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur,
                  (this->m_prio_torrents).
                  super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar4) {
              this_00 = (ppVar4->first).
                        super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                iVar8 = this_00->_M_use_count;
                do {
                  if (iVar8 == 0) {
                    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    break;
                  }
                  LOCK();
                  iVar7 = this_00->_M_use_count;
                  bVar11 = iVar8 == iVar7;
                  if (bVar11) {
                    this_00->_M_use_count = iVar8 + 1;
                    iVar7 = iVar8;
                  }
                  iVar8 = iVar7;
                  UNLOCK();
                } while (!bVar11);
              }
              if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                bVar11 = true;
              }
              else {
                bVar11 = this_00->_M_use_count == 0;
              }
              if (bVar11) {
                this_01 = (torrent *)0x0;
              }
              else {
                this_01 = (ppVar4->first).
                          super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr;
              }
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              }
              ppVar4 = (this->m_prio_torrents).
                       super__Deque_base<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              iVar8 = ppVar4->second;
              ppVar4->second = iVar8 + -1;
              if ((this_01 != (torrent *)0x0 && 1 < iVar8) &&
                 (bVar11 = torrent::want_peers(this_01), bVar11)) goto LAB_002cfdd6;
              ::std::
              deque<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
              ::pop_front(&this->m_prio_torrents);
            }
            this_01 = (torrent *)0x0;
LAB_002cfdd6:
            if (this_01 == (torrent *)0x0) {
              iVar8 = this->m_download_connect_attempts;
              local_58._M_device = local_48;
              local_58._M_owns = false;
              ::std::unique_lock<std::mutex>::lock(&local_58);
              local_58._M_owns = true;
              iVar7 = (this->m_settings).m_store.m_ints._M_elems[0x72];
              ::std::unique_lock<std::mutex>::~unique_lock(&local_58);
              if (((iVar8 < iVar7) ||
                  ((this->m_torrent_lists).
                   super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                   ._M_elems[3].
                   super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                   .
                   super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
                   *(pointer *)
                    ((long)&(this->m_torrent_lists).
                            super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                            ._M_elems[3].
                            super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                            .
                            super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                            ._M_impl.super__Vector_impl_data + 8))) &&
                 (pptVar2 = (this->m_torrent_lists).
                            super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                            ._M_elems[2].
                            super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                            .
                            super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 pptVar2 !=
                 *(pointer *)
                  ((long)&(this->m_torrent_lists).
                          super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                          ._M_elems[2].
                          super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                          .
                          super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                          ._M_impl.super__Vector_impl_data + 8))) {
                this_01 = pptVar2[this->m_next_downloading_connect_torrent];
                this->m_download_connect_attempts = this->m_download_connect_attempts + 1;
                this->m_next_downloading_connect_torrent =
                     this->m_next_downloading_connect_torrent + 1;
              }
              else {
                this_01 = (this->m_torrent_lists).
                          super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                          ._M_elems[3].
                          super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                          .
                          super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [this->m_next_finished_connect_torrent];
                this->m_download_connect_attempts = 0;
                this->m_next_finished_connect_torrent = this->m_next_finished_connect_torrent + 1;
              }
            }
            bVar11 = torrent::try_connect_peer(this_01);
            if (bVar11) {
              iVar10 = iVar10 + -1;
              counters::inc_stats_counter(local_38,0x33,1);
              iVar9 = 0;
            }
            if (iVar10 == 0) {
              return;
            }
            if (((this->m_torrent_lists).
                 super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                 ._M_elems[2].
                 super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                 .
                 super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 *(pointer *)
                  ((long)&(this->m_torrent_lists).
                          super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                          ._M_elems[2].
                          super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                          .
                          super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                          ._M_impl.super__Vector_impl_data + 8)) &&
               ((this->m_torrent_lists).
                super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                ._M_elems[3].
                super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                .
                super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                *(pointer *)
                 ((long)&(this->m_torrent_lists).
                         super_array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>
                         ._M_elems[3].
                         super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                         .
                         super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                         ._M_impl.super__Vector_impl_data + 8))) {
              return;
            }
            if ((int)local_40 < iVar9) {
              return;
            }
            iVar9 = iVar9 + 1;
            sVar5 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count;
            local_58._M_device = local_48;
            local_58._M_owns = false;
            ::std::unique_lock<std::mutex>::lock(&local_58);
            local_58._M_owns = true;
            iVar8 = (this->m_settings).m_store.m_ints._M_elems[0x55];
            ::std::unique_lock<std::mutex>::~unique_lock(&local_58);
          } while ((int)sVar5 < iVar8);
        }
      }
    }
  }
  return;
}

Assistant:

void session_impl::try_connect_more_peers()
	{
		if (m_abort) return;

		if (num_connections() >= m_settings.get_int(settings_pack::connections_limit))
			return;

		// this is the maximum number of connections we will
		// attempt this tick
		int max_connections = m_settings.get_int(settings_pack::connection_speed);

		// this loop will "hand out" connection_speed to the torrents, in a round
		// robin fashion, so that every torrent is equally likely to connect to a
		// peer

		// boost connections are connections made by torrent connection
		// boost, which are done immediately on a tracker response. These
		// connections needs to be deducted from the regular connection attempt
		// quota for this tick
		if (m_boost_connections > 0)
		{
			if (m_boost_connections > max_connections)
			{
				m_boost_connections -= max_connections;
				max_connections = 0;
			}
			else
			{
				max_connections -= m_boost_connections;
				m_boost_connections = 0;
			}
		}

		// zero connections speeds are allowed, we just won't make any connections
		if (max_connections <= 0) return;

		// TODO: use a lower limit than m_settings.connections_limit
		// to allocate the to 10% or so of connection slots for incoming
		// connections
		// cap this at max - 1, since we may add one below
		int const limit = std::min(m_settings.get_int(settings_pack::connections_limit)
			- num_connections(), std::numeric_limits<int>::max() - 1);

		// this logic is here to smooth out the number of new connection
		// attempts over time, to prevent connecting a large number of
		// sockets, wait 10 seconds, and then try again
		if (m_settings.get_bool(settings_pack::smooth_connects) && max_connections > (limit+1) / 2)
			max_connections = (limit + 1) / 2;

		aux::vector<torrent*>& want_peers_download = m_torrent_lists[torrent_want_peers_download];
		aux::vector<torrent*>& want_peers_finished = m_torrent_lists[torrent_want_peers_finished];

		// if no torrent want any peers, just return
		if (want_peers_download.empty() && want_peers_finished.empty()) return;

		// if we don't have any connection attempt quota, return
		if (max_connections <= 0) return;

		int steps_since_last_connect = 0;
		int const num_torrents = int(want_peers_finished.size() + want_peers_download.size());
		for (;;)
		{
			if (m_next_downloading_connect_torrent >= int(want_peers_download.size()))
				m_next_downloading_connect_torrent = 0;

			if (m_next_finished_connect_torrent >= int(want_peers_finished.size()))
				m_next_finished_connect_torrent = 0;

			torrent* t = nullptr;
			// there are prioritized torrents. Pick one of those
			while (!m_prio_torrents.empty())
			{
				t = m_prio_torrents.front().first.lock().get();
				--m_prio_torrents.front().second;
				if (m_prio_torrents.front().second > 0
					&& t != nullptr
					&& t->want_peers()) break;
				m_prio_torrents.pop_front();
				t = nullptr;
			}

			if (t == nullptr)
			{
				if ((m_download_connect_attempts >= m_settings.get_int(
						settings_pack::connect_seed_every_n_download)
					&& !want_peers_finished.empty())
						|| want_peers_download.empty())
				{
					// pick a finished torrent to give a peer to
					t = want_peers_finished[m_next_finished_connect_torrent];
					TORRENT_ASSERT(t->want_peers_finished());
					m_download_connect_attempts = 0;
					++m_next_finished_connect_torrent;
				}
				else
				{
					// pick a downloading torrent to give a peer to
					t = want_peers_download[m_next_downloading_connect_torrent];
					TORRENT_ASSERT(t->want_peers_download());
					++m_download_connect_attempts;
					++m_next_downloading_connect_torrent;
				}
			}

			TORRENT_ASSERT(t->want_peers());
			TORRENT_ASSERT(!t->is_torrent_paused());

			if (t->try_connect_peer())
			{
				--max_connections;
				steps_since_last_connect = 0;
				m_stats_counters.inc_stats_counter(counters::connection_attempts);
			}

			++steps_since_last_connect;

			// if there are no more free connection slots, abort
			if (max_connections == 0) return;
			// there are no more torrents that want peers
			if (want_peers_download.empty() && want_peers_finished.empty()) break;
			// if we have gone a whole loop without
			// handing out a single connection, break
			if (steps_since_last_connect > num_torrents + 1) break;
			// maintain the global limit on number of connections
			if (num_connections() >= m_settings.get_int(settings_pack::connections_limit)) break;
		}
	}